

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O3

void __thiscall
sptk::reaper::FdFilter::RationalApproximation(FdFilter *this,float a,int *k,int *l,int qlim)

{
  float fVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar4 = (float)(int)ABS(a);
  if (qlim < 1) {
    fVar8 = 1.0;
    fVar9 = 1.0;
  }
  else {
    fVar5 = 1.0;
    fVar6 = 1.0;
    fVar9 = 1.0;
    fVar8 = 1.0;
    do {
      fVar7 = (ABS(a) - fVar4) * fVar5;
      fVar10 = (float)(int)(fVar7 + 0.5);
      fVar7 = ABS((fVar7 - fVar10) / fVar5);
      fVar1 = fVar5;
      if (fVar6 <= fVar7) {
        fVar1 = fVar9;
      }
      fVar9 = fVar1;
      fVar8 = (float)(~-(uint)(fVar7 < fVar6) & (uint)fVar8 | (uint)fVar10 & -(uint)(fVar7 < fVar6))
      ;
      fVar5 = fVar5 + 1.0;
      if (fVar6 <= fVar7) {
        fVar7 = fVar6;
      }
      fVar6 = fVar7;
    } while (fVar5 <= (float)qlim);
  }
  iVar2 = (int)(fVar4 * fVar9 + fVar8);
  iVar3 = -iVar2;
  if (0.0 < a) {
    iVar3 = iVar2;
  }
  *k = iVar3;
  *l = (int)fVar9;
  return;
}

Assistant:

void FdFilter::RationalApproximation(float a, int *k, int *l, int qlim) {
  float aa, af, q, em, qq = 1.0, pp = 1.0, ps, e;
  int ai, ip, i;

  aa = fabs(a);
  ai = static_cast<int>(aa);
  i = ai;
  af = aa - i;
  q = 0;
  em = 1.0;
  while (++q <= qlim) {
    ps = q * af;
    ip = static_cast<int>(ps + 0.5);
    e = fabs((ps - static_cast<float>(ip)) / q);
    if (e < em) {
      em = e;
      pp = ip;
      qq = q;
    }
  }
  *k = static_cast<int>((ai * qq) + pp);
  *k = (a > 0)? *k : -(*k);
  *l = static_cast<int>(qq);
}